

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::FillPrefixesCMakeVariable(cmFindPackageCommand *this)

{
  pointer pcVar1;
  mapped_type *this_00;
  size_t startIndex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string debugBuffer;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CMAKE_PREFIX_PATH","");
  cmSearchPath::AddCMakePath(this_00,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)local_68._M_string_length,0x7b50bd);
    startIndex = anon_unknown.dwarf_88393a::collectPathsForDebug(&local_68,this_00,0);
  }
  else {
    startIndex = 0;
  }
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CMAKE_FRAMEWORK_PATH","");
  cmSearchPath::AddCMakePath(this_00,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CMAKE_APPBUNDLE_PATH","");
  cmSearchPath::AddCMakePath(this_00,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_88._0_8_ = local_68._M_string_length;
    local_88._8_8_ = local_68._M_dataplus._M_p;
    local_88._16_8_ = 0x55;
    local_88._24_8_ =
         "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH variables [CMAKE_FIND_USE_CMAKE_PATH].\n";
    views._M_len = 2;
    views._M_array = (iterator)local_88;
    cmCatViews_abi_cxx11_(&local_48,views);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    anon_unknown.dwarf_88393a::collectPathsForDebug(&local_68,this_00,startIndex);
    local_88._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
    local_88._0_8_ = (this->DebugBuffer)._M_string_length;
    local_88._16_8_ = local_68._M_string_length;
    local_88._24_8_ = local_68._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_88;
    cmCatViews_abi_cxx11_(&local_48,views_00);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMake];
  std::string debugBuffer;
  std::size_t debugOffset = 0;

  paths.AddCMakePath("CMAKE_PREFIX_PATH");
  if (this->DebugMode) {
    debugBuffer = "CMAKE_PREFIX_PATH variable [CMAKE_FIND_USE_CMAKE_PATH].\n";
    debugOffset = collectPathsForDebug(debugBuffer, paths);
  }

  paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
  if (this->DebugMode) {
    debugBuffer =
      cmStrCat(debugBuffer,
               "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH variables "
               "[CMAKE_FIND_USE_CMAKE_PATH].\n");
    collectPathsForDebug(debugBuffer, paths, debugOffset);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}